

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t set_conversion_failed_error(archive_read *a,archive_string_conv *sconv,char *name)

{
  int *piVar1;
  char *pcVar2;
  undefined8 in_RDX;
  archive_string_conv *in_RSI;
  archive *in_RDI;
  wchar_t local_4;
  
  piVar1 = __errno_location();
  if (*piVar1 == 0xc) {
    archive_set_error(in_RDI,0xc,"Can\'t allocate memory for %s",in_RDX);
    local_4 = L'\xffffffe2';
  }
  else {
    pcVar2 = archive_string_conversion_charset_name(in_RSI);
    archive_set_error(in_RDI,0x54,"%s can\'t be converted from %s to current locale.",in_RDX,pcVar2)
    ;
    local_4 = L'\xffffffec';
  }
  return local_4;
}

Assistant:

static int
set_conversion_failed_error(struct archive_read *a,
    struct archive_string_conv *sconv, const char *name)
{
	if (errno == ENOMEM) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for %s", name);
		return (ARCHIVE_FATAL);
	}
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "%s can't be converted from %s to current locale.",
	    name, archive_string_conversion_charset_name(sconv));
	return (ARCHIVE_WARN);
}